

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O1

int __thiscall raspicam::_private::Private_Impl_Still::createEncoder(Private_Impl_Still *this)

{
  MMAL_COMPONENT_T **component;
  MMAL_COMPONENT_T *pMVar1;
  MMAL_PORT_T *pMVar2;
  MMAL_PORT_T *pMVar3;
  MMAL_STATUS_T MVar4;
  MMAL_FOURCC_T MVar5;
  uint uVar6;
  size_t sVar7;
  MMAL_POOL_T *pMVar8;
  long lVar9;
  char *pcVar10;
  ostream *poVar11;
  
  component = &this->encoder;
  MVar4 = mmal_component_create("vc.ril.image_encode",component);
  if (MVar4 == MMAL_SUCCESS) {
    pMVar1 = *component;
    if ((pMVar1->input_num == 0) || (pMVar1->output_num == 0)) {
      pcVar10 = this->API_NAME;
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar7 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,sVar7);
      }
      poVar11 = (ostream *)&std::cout;
      pcVar10 = ": Encoder does not have input/output ports.\n";
      lVar9 = 0x2c;
      goto LAB_0010bae7;
    }
    pMVar2 = *pMVar1->input;
    this->encoder_input_port = pMVar2;
    pMVar3 = *pMVar1->output;
    this->encoder_output_port = pMVar3;
    mmal_format_copy(pMVar3->format,pMVar2->format);
    MVar5 = 0xffffffff;
    if ((ulong)this->encoding < 5) {
      MVar5 = *(MMAL_FOURCC_T *)(&DAT_0010dc28 + (ulong)this->encoding * 4);
    }
    pMVar2 = this->encoder_output_port;
    pMVar2->format->encoding = MVar5;
    uVar6 = pMVar2->buffer_size_min;
    if (pMVar2->buffer_size_min < pMVar2->buffer_size_recommended) {
      uVar6 = pMVar2->buffer_size_recommended;
    }
    pMVar2->buffer_size = uVar6;
    uVar6 = pMVar2->buffer_num_min;
    if (pMVar2->buffer_num_min < pMVar2->buffer_num_recommended) {
      uVar6 = pMVar2->buffer_num_recommended;
    }
    pMVar2->buffer_num = uVar6;
    MVar4 = mmal_port_format_commit(pMVar2);
    if (MVar4 != MMAL_SUCCESS) {
      pcVar10 = this->API_NAME;
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar7 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,sVar7);
      }
      poVar11 = (ostream *)&std::cout;
      pcVar10 = ": Could not set format on encoder output port.\n";
      lVar9 = 0x2f;
      goto LAB_0010bae7;
    }
    MVar4 = mmal_component_enable(*component);
    if (MVar4 == MMAL_SUCCESS) {
      pMVar2 = this->encoder_output_port;
      pMVar8 = mmal_port_pool_create(pMVar2,pMVar2->buffer_num,pMVar2->buffer_size);
      this->encoder_pool = pMVar8;
      if (pMVar8 != (MMAL_POOL_T *)0x0) {
        return 0;
      }
      poVar11 = std::operator<<((ostream *)&std::cout,this->API_NAME);
      pcVar10 = ": Failed to create buffer header pool for encoder output port.\n";
      lVar9 = 0x3f;
      goto LAB_0010bae7;
    }
    pcVar10 = this->API_NAME;
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
    }
    else {
      sVar7 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,sVar7);
    }
    pcVar10 = ": Could not enable encoder component.\n";
  }
  else {
    pcVar10 = this->API_NAME;
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
    }
    else {
      sVar7 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,sVar7);
    }
    pcVar10 = ": Could not create encoder component.\n";
  }
  poVar11 = (ostream *)&std::cout;
  lVar9 = 0x26;
LAB_0010bae7:
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,lVar9);
  destroyEncoder(this);
  return -1;
}

Assistant:

int Private_Impl_Still::createEncoder() {
            if ( mmal_component_create ( MMAL_COMPONENT_DEFAULT_IMAGE_ENCODER, &encoder ) ) {
                cout << API_NAME << ": Could not create encoder component.\n";
                destroyEncoder();
                return -1;
            }
            if ( !encoder->input_num || !encoder->output_num ) {
                cout << API_NAME << ": Encoder does not have input/output ports.\n";
                destroyEncoder();
                return -1;
            }

            encoder_input_port = encoder->input[0];
            encoder_output_port = encoder->output[0];

            mmal_format_copy ( encoder_output_port->format, encoder_input_port->format );
            encoder_output_port->format->encoding = convertEncoding ( encoding ); // Set output encoding
            encoder_output_port->buffer_size = encoder_output_port->buffer_size_recommended;
            if ( encoder_output_port->buffer_size < encoder_output_port->buffer_size_min )
                encoder_output_port->buffer_size = encoder_output_port->buffer_size_min;
            encoder_output_port->buffer_num = encoder_output_port->buffer_num_recommended;
            if ( encoder_output_port->buffer_num < encoder_output_port->buffer_num_min )
                encoder_output_port->buffer_num = encoder_output_port->buffer_num_min;

            if ( mmal_port_format_commit ( encoder_output_port ) ) {
                cout << API_NAME << ": Could not set format on encoder output port.\n";
                destroyEncoder();
                return -1;
            }
            if ( mmal_component_enable ( encoder ) ) {
                cout << API_NAME << ": Could not enable encoder component.\n";
                destroyEncoder();
                return -1;
            }
            if ( ! ( encoder_pool = mmal_port_pool_create ( encoder_output_port, encoder_output_port->buffer_num, encoder_output_port->buffer_size ) ) ) {
                cout << API_NAME << ": Failed to create buffer header pool for encoder output port.\n";
                destroyEncoder();
                return -1;
            }
            return 0;
        }